

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

void duckdb::SinkDataChunk
               (Vector *child_vector,SelectionVector *sel,idx_t offset_lists_indices,
               vector<duckdb::LogicalType,_true> *types,
               vector<duckdb::LogicalType,_true> *payload_types,Vector *payload_vector,
               LocalSortState *param_7,bool *data_to_sort,Vector *lists_indices)

{
  reference pvVar1;
  DataChunk key_chunk;
  DataChunk payload_chunk;
  Vector slice;
  
  Vector::Vector(&slice,child_vector,sel,offset_lists_indices);
  DataChunk::DataChunk(&key_chunk);
  DataChunk::InitializeEmpty(&key_chunk,types);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&key_chunk.data,0);
  Vector::Reference(pvVar1,lists_indices);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&key_chunk.data,1);
  Vector::Reference(pvVar1,&slice);
  key_chunk.count = offset_lists_indices;
  DataChunk::DataChunk(&payload_chunk);
  DataChunk::InitializeEmpty(&payload_chunk,payload_types);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&payload_chunk.data,0);
  Vector::Reference(pvVar1,payload_vector);
  payload_chunk.count = offset_lists_indices;
  DataChunk::Verify(&key_chunk);
  DataChunk::Verify(&payload_chunk);
  DataChunk::Flatten(&key_chunk);
  LocalSortState::SinkChunk(param_7,&key_chunk,&payload_chunk);
  *data_to_sort = true;
  DataChunk::~DataChunk(&payload_chunk);
  DataChunk::~DataChunk(&key_chunk);
  Vector::~Vector(&slice);
  return;
}

Assistant:

void SinkDataChunk(Vector *child_vector, SelectionVector &sel, idx_t offset_lists_indices, vector<LogicalType> &types,
                   vector<LogicalType> &payload_types, Vector &payload_vector, LocalSortState &local_sort_state,
                   bool &data_to_sort, Vector &lists_indices) {

	// slice the child vector
	Vector slice(*child_vector, sel, offset_lists_indices);

	// initialize and fill key_chunk
	DataChunk key_chunk;
	key_chunk.InitializeEmpty(types);
	key_chunk.data[0].Reference(lists_indices);
	key_chunk.data[1].Reference(slice);
	key_chunk.SetCardinality(offset_lists_indices);

	// initialize and fill key_chunk and payload_chunk
	DataChunk payload_chunk;
	payload_chunk.InitializeEmpty(payload_types);
	payload_chunk.data[0].Reference(payload_vector);
	payload_chunk.SetCardinality(offset_lists_indices);

	key_chunk.Verify();
	payload_chunk.Verify();

	// sink
	key_chunk.Flatten();
	local_sort_state.SinkChunk(key_chunk, payload_chunk);
	data_to_sort = true;
}